

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_dimensional_inverse_fast_fourier_transform.cc
# Opt level: O2

void __thiscall
sptk::TwoDimensionalInverseFastFourierTransform::TwoDimensionalInverseFastFourierTransform
          (TwoDimensionalInverseFastFourierTransform *this,int num_row,int num_column,int fft_length
          )

{
  this->_vptr_TwoDimensionalInverseFastFourierTransform =
       (_func_int **)&PTR__TwoDimensionalInverseFastFourierTransform_00111ca0;
  this->num_row_ = num_row;
  this->num_column_ = num_column;
  this->fft_length_ = fft_length;
  InverseFastFourierTransform::InverseFastFourierTransform
            (&this->inverse_fast_fourier_transform_,fft_length);
  this->is_valid_ = true;
  if ((((this->num_row_ < 1) || (this->fft_length_ < this->num_row_)) ||
      (fft_length < this->num_column_ || this->num_column_ < 1)) ||
     ((this->inverse_fast_fourier_transform_).fast_fourier_transform_.is_valid_ == false)) {
    this->is_valid_ = false;
  }
  return;
}

Assistant:

TwoDimensionalInverseFastFourierTransform::
    TwoDimensionalInverseFastFourierTransform(int num_row, int num_column,
                                              int fft_length)
    : num_row_(num_row),
      num_column_(num_column),
      fft_length_(fft_length),
      inverse_fast_fourier_transform_(fft_length_),
      is_valid_(true) {
  if (num_row_ <= 0 || fft_length_ < num_row_ || num_column_ <= 0 ||
      fft_length < num_column_ || !inverse_fast_fourier_transform_.IsValid()) {
    is_valid_ = false;
    return;
  }
}